

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHelper.cc
# Opt level: O1

void OpenMesh::IO::write_float(float _f,FILE *_out,bool _swap)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 uVar3;
  undefined7 in_register_00000031;
  undefined4 local_c;
  u3 fc;
  
  local_c = _f;
  if ((int)CONCAT71(in_register_00000031,_swap) != 0) {
    local_c._0_1_ = SUB41(_f,0);
    uVar3 = (undefined1)local_c;
    local_c._3_1_ = (undefined1)((uint)_f >> 0x18);
    local_c._1_2_ = (ushort)((uint)_f >> 8);
    uVar1 = local_c._1_2_ << 8;
    uVar2 = local_c._1_2_ >> 8;
    local_c = (float)CONCAT13(uVar3,CONCAT21(uVar1 | uVar2,local_c._3_1_));
  }
  fwrite(&local_c,1,4,(FILE *)_out);
  return;
}

Assistant:

void write_float(float _f, FILE* _out, bool _swap)
{
  union u3 { float f; unsigned char c[4]; } fc;
  fc.f = _f;
  if (_swap) {
    std::swap(fc.c[0], fc.c[3]);
    std::swap(fc.c[1], fc.c[2]);
  }
  fwrite((char*)fc.c, 1, 4, _out);
}